

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O2

void la_adsc_contract_request_format_text(la_adsc_formatter_ctx_t *ctx,char *label,void *data)

{
  byte *pbVar1;
  undefined8 *puVar2;
  size_t sVar3;
  la_list *l;
  uint uVar4;
  
  la_vstring_append_sprintf(ctx->vstr,"%*s%s:\n",(ulong)(uint)ctx->indent,"",label);
  uVar4 = ctx->indent + 1;
  ctx->indent = uVar4;
  la_vstring_append_sprintf(ctx->vstr,"%*sContract number: %u\n",(ulong)uVar4,"",(ulong)*data);
  sVar3 = la_list_length(*(la_list **)((long)data + 8));
  if (sVar3 != 0) {
    for (l = *(la_list **)((long)data + 8); l != (la_list *)0x0; l = la_list_next(l)) {
      pbVar1 = (byte *)l->data;
      puVar2 = *(undefined8 **)(pbVar1 + 8);
      if (puVar2 == (undefined8 *)0x0) {
        la_vstring_append_sprintf
                  (ctx->vstr,"%*s-- Unparseable tag %u\n",(ulong)(uint)ctx->indent,"",(ulong)*pbVar1
                  );
        break;
      }
      (*(code *)puVar2[3])(ctx,*puVar2,*(undefined8 *)(pbVar1 + 0x10));
    }
    ctx->indent = ctx->indent + -1;
  }
  return;
}

Assistant:

LA_ADSC_FORMATTER_FUN(la_adsc_contract_request_format_text) {
	la_adsc_req_t const *r = data;
	LA_ISPRINTF(ctx->vstr, ctx->indent, "%s:\n", label);
	ctx->indent++;
	LA_ISPRINTF(ctx->vstr, ctx->indent, "Contract number: %u\n", r->contract_num);

	size_t len = la_list_length(r->req_tag_list);
	if(len == 0) {
		return;
	}
	for(la_list *ptr = r->req_tag_list; ptr != NULL; ptr = la_list_next(ptr)) {
		la_adsc_tag_t *t = ptr->data;
		if(!t->type) {
			LA_ISPRINTF(ctx->vstr, ctx->indent, "-- Unparseable tag %u\n", t->tag);
			break;
		}
		la_assert(t->type->format_text != NULL);
		t->type->format_text(ctx, t->type->label, t->data);
	}
	ctx->indent--;
}